

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O1

void __thiscall IRBuilder::BuildBrEnvProperty(IRBuilder *this,OpCode newOpcode,uint32 offset)

{
  short sVar1;
  code *pcVar2;
  bool bVar3;
  RegSlot reg;
  PropertyId propertyId;
  uint uVar4;
  undefined4 *puVar5;
  OpLayoutBrEnvProperty *pOVar6;
  JITTimeFunctionBody *pJVar7;
  SymOpnd *pSVar8;
  RegOpnd *dstOpnd;
  Instr *instr;
  PropertySym *sym;
  BranchInstr *branchInstr;
  OpCode opcode;
  
  bVar3 = OpCodeAttr::HasMultiSizeLayout(newOpcode);
  if (bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x1d25,"(!OpCodeAttr::HasMultiSizeLayout(newOpcode))",
                       "!OpCodeAttr::HasMultiSizeLayout(newOpcode)");
    if (!bVar3) goto LAB_004cd600;
    *puVar5 = 0;
  }
  pOVar6 = Js::ByteCodeReader::BrEnvProperty(&this->m_jnReader);
  pJVar7 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
  reg = JITTimeFunctionBody::GetEnvReg(pJVar7);
  pSVar8 = BuildFieldOpnd(this,LdSlotArr,reg,pOVar6->SlotIndex,0xffffffff,PropertyKindSlotArray,
                          0xffffffff);
  dstOpnd = IR::RegOpnd::New(TyVar,this->m_func);
  instr = IR::Instr::New(LdSlotArr,&dstOpnd->super_Opnd,&pSVar8->super_Opnd,this->m_func);
  AddInstr(this,instr,offset);
  pJVar7 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
  propertyId = JITTimeFunctionBody::GetReferencedPropertyId(pJVar7,pOVar6->PropertyIdIndex);
  uVar4 = Js::ByteCodeReader::GetCurrentOffset(&this->m_jnReader);
  sVar1 = pOVar6->RelativeJumpOffset;
  sym = PropertySym::New(dstOpnd->m_sym,propertyId,pOVar6->PropertyIdIndex,0xffffffff,
                         PropertyKindData,this->m_func);
  pSVar8 = IR::SymOpnd::New(&sym->super_Sym,TyVar,this->m_func);
  if ((newOpcode != BrOnHasLocalEnvProperty) && (newOpcode != BrOnHasEnvProperty)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x1d39,
                       "(newOpcode == Js::OpCode::BrOnHasEnvProperty || newOpcode == Js::OpCode::BrOnHasLocalEnvProperty)"
                       ,
                       "newOpcode == Js::OpCode::BrOnHasEnvProperty || newOpcode == Js::OpCode::BrOnHasLocalEnvProperty"
                      );
    if (!bVar3) {
LAB_004cd600:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  opcode = BrOnHasLocalProperty;
  if (newOpcode == BrOnHasEnvProperty) {
    opcode = BrOnHasProperty;
  }
  branchInstr = IR::BranchInstr::New(opcode,(LabelInstr *)0x0,&pSVar8->super_Opnd,this->m_func);
  AddBranchInstr(this,branchInstr,offset,uVar4 + (int)sVar1);
  return;
}

Assistant:

void
IRBuilder::BuildBrEnvProperty(Js::OpCode newOpcode, uint32 offset)
{
    Assert(!OpCodeAttr::HasMultiSizeLayout(newOpcode));

    const unaligned   Js::OpLayoutBrEnvProperty *branchInsn = m_jnReader.BrEnvProperty();
    IR::Instr *instr;
    IR::BranchInstr * branchInstr;
    IR::RegOpnd *regOpnd;
    IR::SymOpnd *fieldOpnd;
    PropertySym *fieldSym;

    fieldOpnd = this->BuildFieldOpnd(Js::OpCode::LdSlotArr, this->GetEnvReg(), branchInsn->SlotIndex, (Js::PropertyIdIndexType)-1, PropertyKindSlotArray);
    regOpnd = IR::RegOpnd::New(TyVar, m_func);
    instr = IR::Instr::New(Js::OpCode::LdSlotArr, regOpnd, fieldOpnd, m_func);
    this->AddInstr(instr, offset);

    Js::PropertyId    propertyId =
        m_func->GetJITFunctionBody()->GetReferencedPropertyId(branchInsn->PropertyIdIndex);
    unsigned int      targetOffset = m_jnReader.GetCurrentOffset() + branchInsn->RelativeJumpOffset;\
    fieldSym = PropertySym::New(regOpnd->m_sym, propertyId, branchInsn->PropertyIdIndex, (uint)-1, PropertyKindData, m_func);
    fieldOpnd = IR::SymOpnd::New(fieldSym, TyVar, m_func);

    Assert(newOpcode == Js::OpCode::BrOnHasEnvProperty || newOpcode == Js::OpCode::BrOnHasLocalEnvProperty);
    branchInstr = IR::BranchInstr::New(newOpcode == Js::OpCode::BrOnHasEnvProperty ? Js::OpCode::BrOnHasProperty : Js::OpCode::BrOnHasLocalProperty, nullptr, fieldOpnd, m_func);
    this->AddBranchInstr(branchInstr, offset, targetOffset);
}